

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O3

void __thiscall preprocessor_test_arguments_Test::TestBody(preprocessor_test_arguments_Test *this)

{
  undefined8 *puVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper local_28;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  internal local_18 [8];
  undefined8 *local_10;
  
  local_20._M_head_impl._0_4_ = 1;
  local_28.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"(int)1","(int)1",(int *)&local_20,(int *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_28.data_ = (AssertHelperData *)0x2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_18,"(size_t)first_remove[0]","(size_t)2",(unsigned_long *)&local_20,
             (unsigned_long *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_28.data_ = (AssertHelperData *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_18,"(size_t)first_remove[1]","(size_t)3",(unsigned_long *)&local_20,
             (unsigned_long *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  local_28.data_ = (AssertHelperData *)&DAT_00000004;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_18,"(size_t)first_remove[2]","(size_t)4",(unsigned_long *)&local_20,
             (unsigned_long *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl._0_4_ = 2;
  local_28.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"(int)2","(int)2",(int *)&local_20,(int *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_28.data_ = (AssertHelperData *)0x1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_18,"(size_t)second_remove[0]","(size_t)1",(unsigned_long *)&local_20,
             (unsigned_long *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_28.data_ = (AssertHelperData *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_18,"(size_t)second_remove[1]","(size_t)3",(unsigned_long *)&local_20,
             (unsigned_long *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  local_28.data_ = (AssertHelperData *)&DAT_00000004;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_18,"(size_t)second_remove[2]","(size_t)4",(unsigned_long *)&local_20,
             (unsigned_long *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl = local_20._M_head_impl & 0xffffffff00000000;
  local_28.data_ = local_28.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"(int)0","(int)0",(int *)&local_20,(int *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl._0_4_ = 1;
  local_28.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"(int)1","(int)1",(int *)&local_20,(int *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl._0_4_ = 2;
  local_28.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"(int)2","(int)2",(int *)&local_20,(int *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl._0_4_ = 3;
  local_28.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"(int)3","(int)3",(int *)&local_20,(int *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl._0_4_ = 4;
  local_28.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"(int)4","(int)4",(int *)&local_20,(int *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  puVar1 = local_10;
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(puVar1);
  }
  local_20._M_head_impl = local_20._M_head_impl & 0xffffffff00000000;
  local_28.data_ = local_28.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"(int)0","(int)0",(int *)&local_20,(int *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(local_10);
  }
  return;
}

Assistant:

TEST_F(preprocessor_test, arguments)
{
	size_t first_remove[] = { PREPROCESSOR_ARGS_FIRST_REMOVE(1, 2, 3, 4) };

	size_t second_remove[] = { PREPROCESSOR_ARGS_SECOND_REMOVE(1, 2, 3, 4) };

	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_FIRST(1, 2, 3, 4, 5, 6));

	EXPECT_EQ((size_t)first_remove[0], (size_t)2);

	EXPECT_EQ((size_t)first_remove[1], (size_t)3);

	EXPECT_EQ((size_t)first_remove[2], (size_t)4);

	EXPECT_EQ((int)2, (int)PREPROCESSOR_ARGS_SECOND(1, 2, 3, 4, 5, 6));

	EXPECT_EQ((size_t)second_remove[0], (size_t)1);

	EXPECT_EQ((size_t)second_remove[1], (size_t)3);

	EXPECT_EQ((size_t)second_remove[2], (size_t)4);

	EXPECT_EQ((int)0, (int)PREPROCESSOR_ARGS_COUNT());

	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_COUNT(a));

	EXPECT_EQ((int)2, (int)PREPROCESSOR_ARGS_COUNT(a, b));

	EXPECT_EQ((int)3, (int)PREPROCESSOR_ARGS_COUNT(a, b, c));

	EXPECT_EQ((int)4, (int)PREPROCESSOR_ARGS_COUNT(a, b, c, d));

	EXPECT_EQ((int)0, (int)PREPROCESSOR_ARGS_COUNT(/* ... */));
}